

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O1

int DTSStreamReader::buf14To16(uint8_t *p_out,uint8_t *p_in,int i_in,int i_le)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  
  if (0 < i_in) {
    uVar5 = 0;
    iVar3 = 0;
    iVar6 = 0;
    uVar8 = 0;
    do {
      if ((uVar5 & 1) == 0) {
        bVar7 = p_in[uVar5 + (long)i_le] & 0x3f;
        iVar4 = 6;
      }
      else {
        bVar7 = p_in[uVar5 - (long)i_le];
        iVar4 = 8;
      }
      if (iVar6 < 8) {
        iVar1 = 8 - iVar6;
        if (iVar4 < 8 - iVar6) {
          iVar1 = iVar4;
        }
        cVar2 = (char)iVar4;
        iVar4 = iVar4 - iVar1;
        uVar8 = (uint)(bVar7 >> ((byte)iVar4 & 0x1f)) | uVar8 << ((byte)iVar1 & 0x1f);
        bVar7 = bVar7 & (byte)(0xff >> (((byte)iVar1 - cVar2) + 8 & 0x1f));
        iVar6 = iVar6 + iVar1;
      }
      if (iVar6 == 8) {
        p_out[iVar3] = (uint8_t)uVar8;
        iVar3 = iVar3 + 1;
        uVar8 = 0;
        iVar6 = 0;
      }
      iVar6 = iVar6 + iVar4;
      uVar5 = uVar5 + 1;
      uVar8 = (uint)(byte)(bVar7 | (byte)((uVar8 & 0xff) << ((byte)iVar4 & 0x1f)));
    } while ((uint)i_in != uVar5);
    return iVar3;
  }
  return 0;
}

Assistant:

int DTSStreamReader::buf14To16(uint8_t* p_out, const uint8_t* p_in, const int i_in, const int i_le)
{
    unsigned char tmp, cur = 0;
    int bits_in, bits_out = 0;
    int i_out = 0;
    for (int i = 0; i < i_in; i++)
    {
        if (i % 2)
        {
            tmp = p_in[i - i_le];
            bits_in = 8;
        }
        else
        {
            tmp = p_in[i + i_le] & 0x3F;
            bits_in = 8 - 2;
        }

        if (bits_out < 8)
        {
            const int need = (std::min)(8 - bits_out, bits_in);
            cur <<= need;
            cur |= (tmp >> (bits_in - need));
            tmp <<= (8 - bits_in + need);
            tmp >>= (8 - bits_in + need);
            bits_in -= need;
            bits_out += need;
        }
        if (bits_out == 8)
        {
            p_out[i_out] = cur;
            cur = 0;
            bits_out = 0;
            i_out++;
        }

        bits_out += bits_in;
        cur <<= bits_in;
        cur |= tmp;
    }
    return i_out;
}